

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::reallocate
          (array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this,u32 new_size)

{
  SAttribute *pSVar1;
  SAttribute *pSVar2;
  void *pvVar3;
  ulong *puVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  
  pSVar1 = this->data;
  lVar6 = (ulong)new_size * 0x20;
  puVar4 = (ulong *)operator_new__(lVar6 + 8);
  *puVar4 = (ulong)new_size;
  if (new_size != 0) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)puVar4 + lVar7 + 8) = 0;
      *(undefined8 *)((long)puVar4 + lVar7 + 0x10) = 0x100000001;
      puVar5 = (undefined1 *)operator_new__(1);
      *(undefined1 **)((long)puVar4 + lVar7 + 8) = puVar5;
      *puVar5 = 0;
      *(undefined8 *)((long)puVar4 + lVar7 + 0x18) = 0;
      *(undefined8 *)((long)puVar4 + lVar7 + 0x20) = 0x100000001;
      puVar5 = (undefined1 *)operator_new__(1);
      *(undefined1 **)((long)puVar4 + lVar7 + 0x18) = puVar5;
      *puVar5 = 0;
      lVar7 = lVar7 + 0x20;
    } while (lVar6 != lVar7);
  }
  this->data = (SAttribute *)(puVar4 + 1);
  this->allocated = new_size;
  if (this->used < new_size) {
    new_size = this->used;
  }
  if (0 < (int)new_size) {
    lVar6 = 0;
    do {
      pSVar2 = this->data;
      string<char>::operator=
                ((string<char> *)((long)&(pSVar2->Name).array + lVar6),
                 (string<char> *)((long)&(pSVar1->Name).array + lVar6));
      string<char>::operator=
                ((string<char> *)((long)&(pSVar2->Value).array + lVar6),
                 (string<char> *)((long)&(pSVar1->Value).array + lVar6));
      lVar6 = lVar6 + 0x20;
    } while ((ulong)new_size << 5 != lVar6);
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (pSVar1 != (SAttribute *)0x0) {
    lVar6._0_4_ = pSVar1[-1].Value.allocated;
    lVar6._4_4_ = pSVar1[-1].Value.used;
    if (lVar6 != 0) {
      lVar6 = lVar6 << 5;
      do {
        pvVar3 = *(void **)((long)pSVar1 + lVar6 + -0x10);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        pvVar3 = *(void **)((long)&pSVar1[-1].Name.array + lVar6);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != 0);
    }
    operator_delete__(&pSVar1[-1].Value.allocated);
    return;
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}